

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Epoll.cpp
# Opt level: O0

int __thiscall hwnet::Epoll::RunOnce(Epoll *this)

{
  undefined8 *puVar1;
  int iVar2;
  int *piVar3;
  epoll_event *peVar4;
  bool bVar5;
  epoll_event *event;
  int i;
  long __result;
  long nfds;
  epoll_event *tmp;
  Epoll *this_local;
  
  do {
    iVar2 = epoll_wait(this->epfd,(epoll_event *)this->events,this->maxevents,-1);
    bVar5 = false;
    if (iVar2 == -1) {
      piVar3 = __errno_location();
      bVar5 = *piVar3 == 4;
    }
  } while (bVar5);
  if (iVar2 < 1) {
    this_local._4_4_ = -1;
  }
  else {
    for (event._4_4_ = 0; event._4_4_ < iVar2; event._4_4_ = event._4_4_ + 1) {
      puVar1 = (undefined8 *)this->events[event._4_4_].data.ptr;
      (**(code **)*puVar1)(puVar1,this->events[event._4_4_].events);
    }
    if (iVar2 == this->maxevents) {
      this->maxevents = this->maxevents << 2;
      peVar4 = (epoll_event *)realloc(this->events,(long)this->maxevents * 0xc);
      if (peVar4 == (epoll_event *)0x0) {
        return -1;
      }
      this->events = peVar4;
    }
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int Epoll::RunOnce() {
	epoll_event *tmp;
	auto nfds = TEMP_FAILURE_RETRY(epoll_wait(this->epfd,this->events,this->maxevents,-1));
	if(nfds > 0) {
		for(auto i=0; i < nfds ; ++i) {
			epoll_event *event = &events[i];
			((Channel*)event->data.ptr)->OnActive(event->events);
		}	
		if(nfds == this->maxevents){
			this->maxevents <<= 2;
			tmp = (epoll_event*)realloc(this->events,sizeof(*this->events)*this->maxevents);
			if(nullptr == tmp) {
				//log error
				return -1;
			}
			this->events = tmp;
		}
		return 0;			
	} else {
		//log error
		return -1;
	}
}